

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O3

int Fra_FraigSat(Aig_Man_t *pMan,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,int nLearnedStart,
                int nLearnedDelta,int nLearnedPerce,int fFlipBits,int fAndOuts,int fNewSolver,
                int fVerbose)

{
  int iVar1;
  Cnf_Dat_t *pCnf;
  sat_solver2 *s;
  sat_solver *s_00;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  timespec local_58;
  Vec_Int_t *local_48;
  ABC_INT64_T local_40;
  ABC_INT64_T local_38;
  
  local_40 = nConfLimit;
  if (fNewSolver == 0) {
    local_48 = (Vec_Int_t *)CONCAT44(local_48._4_4_,nLearnedPerce);
    local_38 = nInsLimit;
    iVar1 = clock_gettime(3,&local_58);
    if (iVar1 < 0) {
      lVar5 = 1;
    }
    else {
      lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_58.tv_nsec),8);
      lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_58.tv_sec * -1000000;
    }
    if (pMan->nRegs != 0) {
      __assert_fail("Aig_ManRegNum(pMan) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCec.c"
                    ,0xac,
                    "int Fra_FraigSat(Aig_Man_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
                   );
    }
    pMan->pData = (void *)0x0;
    pCnf = Cnf_Derive(pMan,pMan->nObjs[3]);
    if (fFlipBits != 0) {
      Cnf_DataTranformPolarity(pCnf,0);
    }
    if (fVerbose != 0) {
      printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)pCnf->nVars,
             (ulong)(uint)pCnf->nClauses,(ulong)(uint)pCnf->nLiterals);
      iVar4 = 3;
      iVar1 = clock_gettime(3,&local_58);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%s =","Time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar6 + lVar5) / 1000000.0);
    }
    s_00 = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf,1,0);
    if (s_00 == (sat_solver *)0x0) goto LAB_005f67f2;
    if (nLearnedStart != 0) {
      s_00->nLearntMax = nLearnedStart;
      s_00->nLearntStart = nLearnedStart;
    }
    if (nLearnedDelta != 0) {
      s_00->nLearntDelta = nLearnedDelta;
    }
    if ((int)local_48 != 0) {
      s_00->nLearntRatio = (int)local_48;
    }
    if (fVerbose != 0) {
      s_00->fVerbose = fVerbose;
    }
    if (fAndOuts == 0) {
      iVar1 = Cnf_DataWriteOrClause(s_00,pCnf);
    }
    else {
      iVar1 = Cnf_DataWriteAndClauses(s_00,pCnf);
    }
    if (iVar1 != 0) {
      pVVar2 = Cnf_DataCollectPiSatNums(pCnf,pMan);
      Cnf_DataFree(pCnf);
      clock_gettime(3,&local_58);
      iVar1 = sat_solver_simplify(s_00);
      if (iVar1 == 0) {
        if (pVVar2->pArray != (int *)0x0) {
          free(pVVar2->pArray);
        }
        free(pVVar2);
        sat_solver_delete(s_00);
        return 1;
      }
      clock_gettime(3,&local_58);
      iVar4 = 0;
      iVar1 = sat_solver_solve(s_00,(lit *)0x0,(lit *)0x0,local_40,local_38,0,0);
      if (iVar1 == 1) {
        piVar3 = Sat_SolverGetModel(s_00,pVVar2->pArray,pVVar2->nSize);
        pMan->pData = piVar3;
      }
      else {
        iVar4 = -1;
        if (iVar1 != 0) {
          if (iVar1 != -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCec.c"
                          ,0x10a,
                          "int Fra_FraigSat(Aig_Man_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
                         );
          }
          iVar4 = 1;
        }
      }
      if (fVerbose != 0) {
        Sat_SolverPrintStats(_stdout,s_00);
      }
      sat_solver_delete(s_00);
      goto LAB_005f694c;
    }
    sat_solver_delete(s_00);
  }
  else {
    iVar1 = clock_gettime(3,&local_58);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    if (pMan->nRegs != 0) {
      __assert_fail("Aig_ManRegNum(pMan) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCec.c"
                    ,0x3c,
                    "int Fra_FraigSat(Aig_Man_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
                   );
    }
    pMan->pData = (void *)0x0;
    pCnf = Cnf_Derive(pMan,pMan->nObjs[3]);
    if (fFlipBits != 0) {
      Cnf_DataTranformPolarity(pCnf,0);
    }
    if (fVerbose != 0) {
      printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)pCnf->nVars,
             (ulong)(uint)pCnf->nClauses,(ulong)(uint)pCnf->nLiterals);
      iVar4 = 3;
      iVar1 = clock_gettime(3,&local_58);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%s =","Time");
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar6 - lVar5) / 1000000.0);
    }
    s = (sat_solver2 *)Cnf_DataWriteIntoSolver2(pCnf,1,0);
    if (s == (sat_solver2 *)0x0) {
LAB_005f67f2:
      Cnf_DataFree(pCnf);
      return 1;
    }
    if (fAndOuts == 0) {
      iVar1 = Cnf_DataWriteOrClause2(s,pCnf);
    }
    else {
      iVar1 = Cnf_DataWriteAndClauses(s,pCnf);
    }
    if (iVar1 != 0) {
      local_48 = Cnf_DataCollectPiSatNums(pCnf,pMan);
      Cnf_DataFree(pCnf);
      iVar1 = 0x967a74;
      printf("Created SAT problem with %d variable and %d clauses. ",(ulong)(uint)s->size,
             (ulong)(s->stats).clauses);
      Abc_Print(iVar1,"%s =","Time");
      iVar4 = 3;
      iVar1 = clock_gettime(3,&local_58);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar6 - lVar5) / 1000000.0);
      clock_gettime(3,&local_58);
      iVar1 = sat_solver2_simplify(s);
      pVVar2 = local_48;
      if (iVar1 == 0) {
        if (local_48->pArray != (int *)0x0) {
          free(local_48->pArray);
        }
        free(pVVar2);
        sat_solver2_delete(s);
        return 1;
      }
      clock_gettime(3,&local_58);
      if (fVerbose != 0) {
        s->verbosity = 1;
      }
      iVar4 = 0;
      iVar1 = sat_solver2_solve(s,(lit *)0x0,(lit *)0x0,local_40,nInsLimit,0,0);
      pVVar2 = local_48;
      if (iVar1 == 1) {
        piVar3 = Sat_Solver2GetModel(s,local_48->pArray,local_48->nSize);
        pMan->pData = piVar3;
      }
      else {
        iVar4 = -1;
        if (iVar1 != 0) {
          if (iVar1 != -1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraCec.c"
                          ,0x91,
                          "int Fra_FraigSat(Aig_Man_t *, ABC_INT64_T, ABC_INT64_T, int, int, int, int, int, int, int)"
                         );
          }
          iVar4 = 1;
        }
      }
      if (fVerbose != 0) {
        Sat_Solver2PrintStats(_stdout,s);
      }
      sat_solver2_delete(s);
LAB_005f694c:
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
      }
      free(pVVar2);
      return iVar4;
    }
    sat_solver2_delete(s);
  }
  Cnf_DataFree(pCnf);
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_FraigSat( Aig_Man_t * pMan, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int nLearnedStart, int nLearnedDelta, int nLearnedPerce, int fFlipBits, int fAndOuts, int fNewSolver, int fVerbose )
{
    if ( fNewSolver )
    {
        extern void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit );
        extern int    Cnf_DataWriteOrClause2( void * pSat, Cnf_Dat_t * pCnf );

        sat_solver2 * pSat;
        Cnf_Dat_t * pCnf;
        int status, RetValue;
        abctime clk = Abc_Clock();
        Vec_Int_t * vCiIds;

        assert( Aig_ManRegNum(pMan) == 0 );
        pMan->pData = NULL;

        // derive CNF
        pCnf = Cnf_Derive( pMan, Aig_ManCoNum(pMan) );
    //    pCnf = Cnf_DeriveSimple( pMan, Aig_ManCoNum(pMan) );

        if ( fFlipBits ) 
            Cnf_DataTranformPolarity( pCnf, 0 );

        if ( fVerbose )
        {
            printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }

        // convert into SAT solver
        pSat = (sat_solver2 *)Cnf_DataWriteIntoSolver2( pCnf, 1, 0 );
        if ( pSat == NULL )
        {
            Cnf_DataFree( pCnf );
            return 1;
        }

        if ( fAndOuts )
        {
            // assert each output independently
            if ( !Cnf_DataWriteAndClauses( pSat, pCnf ) )
            {
                sat_solver2_delete( pSat );
                Cnf_DataFree( pCnf );
                return 1;
            }
        }
        else
        {
            // add the OR clause for the outputs
            if ( !Cnf_DataWriteOrClause2( pSat, pCnf ) )
            {
                sat_solver2_delete( pSat );
                Cnf_DataFree( pCnf );
                return 1;
            }
        }
        vCiIds = Cnf_DataCollectPiSatNums( pCnf, pMan );
        Cnf_DataFree( pCnf );


        printf( "Created SAT problem with %d variable and %d clauses. ", sat_solver2_nvars(pSat), sat_solver2_nclauses(pSat) );
        ABC_PRT( "Time", Abc_Clock() - clk );

        // simplify the problem
        clk = Abc_Clock();
        status = sat_solver2_simplify(pSat);
//        printf( "Simplified the problem to %d variables and %d clauses. ", sat_solver2_nvars(pSat), sat_solver2_nclauses(pSat) );
//        ABC_PRT( "Time", Abc_Clock() - clk );
        if ( status == 0 )
        {
            Vec_IntFree( vCiIds );
            sat_solver2_delete( pSat );
    //        printf( "The problem is UNSATISFIABLE after simplification.\n" );
            return 1;
        }

        // solve the miter
        clk = Abc_Clock();
        if ( fVerbose )
            pSat->verbosity = 1;
        status = sat_solver2_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
    //        printf( "The problem timed out.\n" );
            RetValue = -1;
        }
        else if ( status == l_True )
        {
    //        printf( "The problem is SATISFIABLE.\n" );
            RetValue = 0;
        }
        else if ( status == l_False )
        {
    //        printf( "The problem is UNSATISFIABLE.\n" );
            RetValue = 1;
        }
        else
            assert( 0 );

    //    Abc_Print( 1, "The number of conflicts = %6d.  ", (int)pSat->stats.conflicts );
    //    Abc_PrintTime( 1, "Solving time", Abc_Clock() - clk );
 
        // if the problem is SAT, get the counterexample
        if ( status == l_True )
        {
            pMan->pData = Sat_Solver2GetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        }
        // free the sat_solver2
        if ( fVerbose )
            Sat_Solver2PrintStats( stdout, pSat );
    //sat_solver2_store_write( pSat, "trace.cnf" );
    //sat_solver2_store_free( pSat );
        sat_solver2_delete( pSat );
        Vec_IntFree( vCiIds );
        return RetValue;
    }
    else
    {
        sat_solver * pSat;
        Cnf_Dat_t * pCnf;
        int status, RetValue;
        abctime clk = Abc_Clock();
        Vec_Int_t * vCiIds;

        assert( Aig_ManRegNum(pMan) == 0 );
        pMan->pData = NULL;

        // derive CNF
        pCnf = Cnf_Derive( pMan, Aig_ManCoNum(pMan) );
    //    pCnf = Cnf_DeriveSimple( pMan, Aig_ManCoNum(pMan) );

        if ( fFlipBits ) 
            Cnf_DataTranformPolarity( pCnf, 0 );

        if ( fVerbose )
        {
            printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }

        // convert into SAT solver
        pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        if ( pSat == NULL )
        {
            Cnf_DataFree( pCnf );
            return 1;
        }

        if ( nLearnedStart )
            pSat->nLearntStart = pSat->nLearntMax = nLearnedStart;
        if ( nLearnedDelta )
            pSat->nLearntDelta = nLearnedDelta;
        if ( nLearnedPerce )
            pSat->nLearntRatio = nLearnedPerce;
        if ( fVerbose )
            pSat->fVerbose = fVerbose;

        if ( fAndOuts )
        {
            // assert each output independently
            if ( !Cnf_DataWriteAndClauses( pSat, pCnf ) )
            {
                sat_solver_delete( pSat );
                Cnf_DataFree( pCnf );
                return 1;
            }
        }
        else
        {
            // add the OR clause for the outputs
            if ( !Cnf_DataWriteOrClause( pSat, pCnf ) )
            {
                sat_solver_delete( pSat );
                Cnf_DataFree( pCnf );
                return 1;
            }
        }
        vCiIds = Cnf_DataCollectPiSatNums( pCnf, pMan );
        Cnf_DataFree( pCnf );


    //    printf( "Created SAT problem with %d variable and %d clauses. ", sat_solver_nvars(pSat), sat_solver_nclauses(pSat) );
    //    ABC_PRT( "Time", Abc_Clock() - clk );

        // simplify the problem
        clk = Abc_Clock();
        status = sat_solver_simplify(pSat);
    //    printf( "Simplified the problem to %d variables and %d clauses. ", sat_solver_nvars(pSat), sat_solver_nclauses(pSat) );
    //    ABC_PRT( "Time", Abc_Clock() - clk );
        if ( status == 0 )
        {
            Vec_IntFree( vCiIds );
            sat_solver_delete( pSat );
    //        printf( "The problem is UNSATISFIABLE after simplification.\n" );
            return 1;
        }

        // solve the miter
        clk = Abc_Clock();
//        if ( fVerbose )
//            pSat->verbosity = 1;
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
    //        printf( "The problem timed out.\n" );
            RetValue = -1;
        }
        else if ( status == l_True )
        {
    //        printf( "The problem is SATISFIABLE.\n" );
            RetValue = 0;
        }
        else if ( status == l_False )
        {
    //        printf( "The problem is UNSATISFIABLE.\n" );
            RetValue = 1;
        }
        else
            assert( 0 );

    //    Abc_Print( 1, "The number of conflicts = %6d.  ", (int)pSat->stats.conflicts );
    //    Abc_PrintTime( 1, "Solving time", Abc_Clock() - clk );
 
        // if the problem is SAT, get the counterexample
        if ( status == l_True )
        {
            pMan->pData = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        }
        // free the sat_solver
        if ( fVerbose )
            Sat_SolverPrintStats( stdout, pSat );
    //sat_solver_store_write( pSat, "trace.cnf" );
    //sat_solver_store_free( pSat );
        sat_solver_delete( pSat );
        Vec_IntFree( vCiIds );
        return RetValue;
    }
}